

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigSynch.c
# Opt level: O0

void Saig_SynchTernaryTransferState(Aig_Man_t *pAig,Vec_Ptr_t *vSimInfo,int nWords)

{
  int iVar1;
  Aig_Obj_t *pAVar2;
  Aig_Obj_t *pAVar3;
  void *pvVar4;
  void *pvVar5;
  int local_48;
  int local_44;
  int w;
  int i;
  uint *pSim1;
  uint *pSim0;
  Aig_Obj_t *pObjLo;
  Aig_Obj_t *pObjLi;
  int nWords_local;
  Vec_Ptr_t *vSimInfo_local;
  Aig_Man_t *pAig_local;
  
  for (local_44 = 0; iVar1 = Saig_ManRegNum(pAig), local_44 < iVar1; local_44 = local_44 + 1) {
    pAVar2 = Saig_ManLi(pAig,local_44);
    pAVar3 = Saig_ManLo(pAig,local_44);
    pvVar4 = Vec_PtrEntry(vSimInfo,pAVar2->Id);
    pvVar5 = Vec_PtrEntry(vSimInfo,pAVar3->Id);
    for (local_48 = 0; local_48 < nWords; local_48 = local_48 + 1) {
      *(undefined4 *)((long)pvVar5 + (long)local_48 * 4) =
           *(undefined4 *)((long)pvVar4 + (long)local_48 * 4);
    }
  }
  return;
}

Assistant:

void Saig_SynchTernaryTransferState( Aig_Man_t * pAig, Vec_Ptr_t * vSimInfo, int nWords )
{
    Aig_Obj_t * pObjLi, * pObjLo;
    unsigned * pSim0, * pSim1;
    int i, w;
    Saig_ManForEachLiLo( pAig, pObjLi, pObjLo, i )
    {
        pSim0 = (unsigned *)Vec_PtrEntry( vSimInfo, pObjLi->Id );
        pSim1 = (unsigned *)Vec_PtrEntry( vSimInfo, pObjLo->Id );
        for ( w = 0; w < nWords; w++ )
            pSim1[w] = pSim0[w];
    }
}